

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ListFieldsMayFailOnStripped
          (Reflection *this,Message *message,bool should_fail,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  byte bVar1;
  int iVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  ulong uVar8;
  int i;
  long lVar9;
  long lVar10;
  long lVar11;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar12;
  uint32_t *local_58;
  FieldDescriptor *field;
  ReflectionSchema *local_40;
  uint32_t *local_38;
  
  ppFVar3 = (output->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar3) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar3;
  }
  if ((this->schema_).default_instance_ != message) {
    if ((this->schema_).has_bits_offset_ == -1) {
      local_58 = (uint32_t *)0x0;
    }
    else {
      local_58 = GetHasBits(this,message);
    }
    local_40 = &this->schema_;
    local_38 = (this->schema_).has_bit_indices_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 4));
    iVar2 = this->last_non_weak_field_index_;
    lVar11 = 0;
    for (lVar9 = 0; lVar9 <= iVar2; lVar9 = lVar9 + 1) {
      lVar10 = *(long *)(this->descriptor_ + 0x28);
      field = (FieldDescriptor *)(lVar10 + lVar11);
      bVar1 = *(byte *)(lVar10 + 1 + lVar11);
      if ((~bVar1 & 0x60) == 0) {
        iVar6 = FieldSize(this,message,field);
        if (0 < iVar6) goto LAB_003936f2;
      }
      else {
        lVar10 = *(long *)(lVar10 + 0x28 + lVar11);
        bVar5 = internal::ReflectionSchema::InRealOneof(local_40,field);
        if (bVar5) {
          if ((bVar1 & 0x10) == 0) {
            lVar10 = 0;
          }
          if ((ulong)*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                              (long)(int)((lVar10 - *(long *)(*(long *)(lVar10 + 0x10) + 0x30)) /
                                         0x28) * 4 + (ulong)(uint)(this->schema_).oneof_case_offset_
                              ) == (long)*(int *)(field + 4)) {
LAB_003936f2:
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::push_back(output,&field);
          }
        }
        else {
          if ((local_58 == (uint32_t *)0x0) || (local_38[lVar9] == 0xffffffff)) {
            bVar5 = HasBit(this,message,field);
          }
          else {
            bVar5 = anon_unknown_0::IsIndexInHasBitSet(local_58,local_38[lVar9]);
          }
          if (bVar5 != false) goto LAB_003936f2;
        }
      }
      lVar11 = lVar11 + 0x48;
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(local_40);
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                 this->descriptor_,this->descriptor_pool_,output);
    }
    ppFVar3 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar3 != ppFVar4) {
      uVar8 = (long)ppFVar4 - (long)ppFVar3 >> 3;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar3,ppFVar4,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar4 - (long)ppFVar3 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar3,ppFVar4);
      }
      else {
        ppFVar12 = ppFVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar3,ppFVar12);
        for (; ppFVar12 != ppFVar4; ppFVar12 = ppFVar12 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFieldsMayFailOnStripped(
    const Message& message, bool should_fail,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!should_fail && schema_.IsFieldStripped(field)) {
      continue;
    }
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          output->push_back(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        CheckInvalidAccess(schema_, field);
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}